

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathIsPositionalPredicate(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,int *maxPos)

{
  double dVar1;
  xmlXPathStepOp *pxVar2;
  double floatval;
  xmlXPathStepOpPtr exprOp;
  int *maxPos_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((((((op->op == XPATH_OP_PREDICATE) || (op->op == XPATH_OP_FILTER)) && (op->ch2 != -1)) &&
       ((pxVar2 = ctxt->comp->steps + op->ch2, pxVar2 != (xmlXPathStepOp *)0x0 &&
        (pxVar2->op == XPATH_OP_VALUE)))) &&
      ((pxVar2->value4 != (void *)0x0 &&
       ((*pxVar2->value4 == 3 &&
        (dVar1 = *(double *)((long)pxVar2->value4 + 0x18), -2147483648.0 < dVar1)))))) &&
     (dVar1 < 2147483647.0)) {
    *maxPos = (int)dVar1;
    if ((dVar1 == (double)*maxPos) && (!NAN(dVar1) && !NAN((double)*maxPos))) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlXPathIsPositionalPredicate(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    int *maxPos)
{

    xmlXPathStepOpPtr exprOp;

    /*
    * BIG NOTE: This is not intended for XPATH_OP_FILTER yet!
    */

    /*
    * If not -1, then ch1 will point to:
    * 1) For predicates (XPATH_OP_PREDICATE):
    *    - an inner predicate operator
    * 2) For filters (XPATH_OP_FILTER):
    *    - an inner filter operator OR
    *    - an expression selecting the node set.
    *      E.g. "key('a', 'b')" or "(//foo | //bar)".
    */
    if ((op->op != XPATH_OP_PREDICATE) && (op->op != XPATH_OP_FILTER))
	return(0);

    if (op->ch2 != -1) {
	exprOp = &ctxt->comp->steps[op->ch2];
    } else
	return(0);

    if ((exprOp != NULL) &&
	(exprOp->op == XPATH_OP_VALUE) &&
	(exprOp->value4 != NULL) &&
	(((xmlXPathObjectPtr) exprOp->value4)->type == XPATH_NUMBER))
    {
        double floatval = ((xmlXPathObjectPtr) exprOp->value4)->floatval;

	/*
	* We have a "[n]" predicate here.
	* TODO: Unfortunately this simplistic test here is not
	* able to detect a position() predicate in compound
	* expressions like "[@attr = 'a" and position() = 1],
	* and even not the usage of position() in
	* "[position() = 1]"; thus - obviously - a position-range,
	* like it "[position() < 5]", is also not detected.
	* Maybe we could rewrite the AST to ease the optimization.
	*/

        if ((floatval > INT_MIN) && (floatval < INT_MAX)) {
	    *maxPos = (int) floatval;
            if (floatval == (double) *maxPos)
                return(1);
        }
    }
    return(0);
}